

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O3

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_avx_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  undefined1 (*pauVar8) [32];
  int iVar9;
  uint uVar10;
  long lVar11;
  undefined1 (*pauVar12) [32];
  undefined1 (*pauVar13) [32];
  uint uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float in_register_000012dc;
  
  iVar3 = a->c;
  if (0 < (long)iVar3) {
    uVar7 = a->h * a->w * a->d * a->elempack;
    lVar11 = 0;
    do {
      pauVar12 = (undefined1 (*) [32])(a->cstep * lVar11 * a->elemsize + (long)a->data);
      pauVar13 = (undefined1 (*) [32])(b->cstep * lVar11 * b->elemsize + (long)b->data);
      pauVar8 = (undefined1 (*) [32])(c->cstep * lVar11 * c->elemsize + (long)c->data);
      if ((int)uVar7 < 8) {
        uVar14 = 0;
      }
      else {
        iVar9 = 7;
        do {
          auVar2 = *pauVar13;
          auVar5 = vrcpps_avx(auVar2);
          auVar17 = *pauVar12;
          fVar19 = auVar17._0_4_ * auVar5._0_4_;
          fVar20 = auVar17._4_4_ * auVar5._4_4_;
          fVar21 = auVar17._8_4_ * auVar5._8_4_;
          fVar22 = auVar17._12_4_ * auVar5._12_4_;
          fVar23 = auVar17._16_4_ * auVar5._16_4_;
          fVar24 = auVar17._20_4_ * auVar5._20_4_;
          fVar25 = auVar17._24_4_ * auVar5._24_4_;
          auVar6._4_4_ = auVar2._4_4_ * fVar20;
          auVar6._0_4_ = auVar2._0_4_ * fVar19;
          auVar6._8_4_ = auVar2._8_4_ * fVar21;
          auVar6._12_4_ = auVar2._12_4_ * fVar22;
          auVar6._16_4_ = auVar2._16_4_ * fVar23;
          auVar6._20_4_ = auVar2._20_4_ * fVar24;
          auVar6._24_4_ = auVar2._24_4_ * fVar25;
          auVar6._28_4_ = auVar2._28_4_;
          auVar2 = vsubps_avx(auVar17,auVar6);
          auVar17._0_4_ = fVar19 + auVar5._0_4_ * auVar2._0_4_;
          auVar17._4_4_ = fVar20 + auVar5._4_4_ * auVar2._4_4_;
          auVar17._8_4_ = fVar21 + auVar5._8_4_ * auVar2._8_4_;
          auVar17._12_4_ = fVar22 + auVar5._12_4_ * auVar2._12_4_;
          auVar17._16_4_ = fVar23 + auVar5._16_4_ * auVar2._16_4_;
          auVar17._20_4_ = fVar24 + auVar5._20_4_ * auVar2._20_4_;
          auVar17._24_4_ = fVar25 + auVar5._24_4_ * auVar2._24_4_;
          auVar17._28_4_ = in_register_000012dc + auVar2._28_4_;
          *pauVar8 = auVar17;
          pauVar12 = pauVar12 + 1;
          pauVar13 = pauVar13 + 1;
          pauVar8 = pauVar8 + 1;
          iVar9 = iVar9 + 8;
          uVar14 = uVar7 & 0xfffffff8;
        } while (iVar9 < (int)uVar7);
      }
      uVar10 = uVar14 | 3;
      while ((int)uVar10 < (int)uVar7) {
        auVar1 = *(undefined1 (*) [16])*pauVar12;
        auVar16 = *(undefined1 (*) [16])*pauVar13;
        auVar4 = vrcpps_avx(auVar16);
        fVar19 = auVar1._0_4_ * auVar4._0_4_;
        fVar20 = auVar1._4_4_ * auVar4._4_4_;
        fVar21 = auVar1._8_4_ * auVar4._8_4_;
        fVar22 = auVar1._12_4_ * auVar4._12_4_;
        in_register_000012dc = 0.0;
        auVar18._0_4_ = auVar16._0_4_ * fVar19;
        auVar18._4_4_ = auVar16._4_4_ * fVar20;
        auVar18._8_4_ = auVar16._8_4_ * fVar21;
        auVar18._12_4_ = auVar16._12_4_ * fVar22;
        auVar1 = vsubps_avx(auVar1,auVar18);
        auVar16._0_4_ = fVar19 + auVar4._0_4_ * auVar1._0_4_;
        auVar16._4_4_ = fVar20 + auVar4._4_4_ * auVar1._4_4_;
        auVar16._8_4_ = fVar21 + auVar4._8_4_ * auVar1._8_4_;
        auVar16._12_4_ = fVar22 + auVar4._12_4_ * auVar1._12_4_;
        *(undefined1 (*) [16])*pauVar8 = auVar16;
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
        pauVar8 = (undefined1 (*) [32])((long)*pauVar8 + 0x10);
        uVar10 = uVar14 + 7;
        uVar14 = uVar14 + 4;
      }
      if (uVar7 - uVar14 != 0 && (int)uVar14 <= (int)uVar7) {
        lVar15 = 0;
        do {
          *(float *)((long)*pauVar8 + lVar15 * 4) =
               *(float *)(*pauVar12 + lVar15 * 4) / *(float *)(*pauVar13 + lVar15 * 4);
          lVar15 = lVar15 + 1;
        } while (uVar7 - uVar14 != (int)lVar15);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar3);
  }
  return iVar3;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}